

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

Float __thiscall pbrt::Image::GetChannel(Image *this,Point2i p,int c,WrapMode2D wrapMode)

{
  span<float> vout;
  span<const_unsigned_char> vin;
  WrapMode2D wrapMode_00;
  bool bVar1;
  const_reference ptr;
  const_reference this_00;
  size_t sVar2;
  const_reference pvVar3;
  Point2i in_RCX;
  int in_EDX;
  int *in_RDI;
  char *in_stack_00000008;
  int in_stack_00000014;
  char *in_stack_00000018;
  LogLevel in_stack_00000024;
  Float r;
  Image *in_stack_ffffffffffffff58;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffff60;
  Tuple2<pbrt::Point2,_int> p_00;
  float *in_stack_ffffffffffffff68;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this_01;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this_02;
  int *piVar4;
  undefined4 in_stack_ffffffffffffff80;
  int iVar5;
  span<float> local_60;
  Point2i *in_stack_ffffffffffffffb8;
  WrapMode in_stack_ffffffffffffffc4;
  value_type_conflict1 in_stack_ffffffffffffffc8;
  value_type_conflict1 local_4;
  
  wrapMode_00.wrap.values[1] = (WrapMode)in_stack_ffffffffffffffc8;
  wrapMode_00.wrap.values[0] = in_stack_ffffffffffffffc4;
  bVar1 = RemapPixelCoords(in_stack_ffffffffffffffb8,in_RCX,wrapMode_00);
  if (bVar1) {
    iVar5 = *in_RDI;
    if (iVar5 == 0) {
      piVar4 = in_RDI + 0xc;
      this_02 = (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                (in_RDI + 0xe);
      sVar2 = PixelOffset(in_stack_ffffffffffffff58,(Point2i)in_stack_ffffffffffffff60);
      ptr = pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
            operator[](this_02,sVar2 + (long)in_EDX);
      pstd::span<const_unsigned_char>::span
                ((span<const_unsigned_char> *)&stack0xffffffffffffffb8,ptr,1);
      pstd::span<float>::span(&local_60,(float *)&stack0xffffffffffffffc8,1);
      vin.n._0_4_ = in_stack_ffffffffffffff80;
      vin.ptr = (uchar *)piVar4;
      vin.n._4_4_ = iVar5;
      vout.n = (size_t)this_02;
      vout.ptr = in_stack_ffffffffffffff68;
      ColorEncoding::ToLinear((ColorEncoding *)in_stack_ffffffffffffff60,vin,vout);
      local_4 = in_stack_ffffffffffffffc8;
    }
    else if (iVar5 == 1) {
      this_01 = (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)(in_RDI + 0x16)
      ;
      sVar2 = PixelOffset(in_stack_ffffffffffffff58,(Point2i)in_stack_ffffffffffffff60);
      this_00 = pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator[]
                          (this_01,sVar2 + (long)in_EDX);
      local_4 = Half::operator_cast_to_float(this_00);
    }
    else {
      if (iVar5 != 2) {
        LogFatal(in_stack_00000024,in_stack_00000018,in_stack_00000014,in_stack_00000008);
      }
      p_00 = (Tuple2<pbrt::Point2,_int>)(in_RDI + 0x1e);
      sVar2 = PixelOffset(in_stack_ffffffffffffff58,(Point2i)p_00);
      pvVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)p_00,
                          sVar2 + (long)in_EDX);
      local_4 = *pvVar3;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    Float GetChannel(Point2i p, int c, WrapMode2D wrapMode = WrapMode::Clamp) const {
        // Remap provided pixel coordinates before reading channel
        if (!RemapPixelCoords(&p, resolution, wrapMode))
            return 0;

        switch (format) {
        case PixelFormat::U256: {  // Return _U256_-encoded pixel channel value
            Float r;
            encoding.ToLinear({&p8[PixelOffset(p) + c], 1}, {&r, 1});
            return r;
        }
        case PixelFormat::Half: {  // Return _Half_-encoded pixel channel value
            return Float(p16[PixelOffset(p) + c]);
        }
        case PixelFormat::Float: {  // Return _Float_-encoded pixel channel value
            return p32[PixelOffset(p) + c];
        }
        default:
            LOG_FATAL("Unhandled PixelFormat");
            return 0;
        }
    }